

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

duckdb_fsst_encoder_t * duckdb_fsst_create(size_t n,size_t *lenIn,u8 **strIn,int zeroTerminated)

{
  u8 *sampleBuf;
  __shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2> *this;
  SymbolTable *__p;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sample_sizes;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> sample;
  _Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false> local_70;
  __shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_58;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_40;
  
  sampleBuf = (u8 *)operator_new__(0x8000);
  local_70._M_head_impl = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  makeSample((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_40,sampleBuf,strIn,
             lenIn,n + (n == 0),
             (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_70);
  this = (__shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x180010);
  switchD_016d4fed::default(this,0,0x180010);
  if (local_70._M_head_impl != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    lenIn = ((local_70._M_head_impl)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_58,
             (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_40);
  __p = buildSymbolTable((Counters *)(this + 1),
                         (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_58,
                         lenIn,zeroTerminated != 0);
  std::__shared_ptr<SymbolTable,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SymbolTable,void>
            ((__shared_ptr<SymbolTable,(__gnu_cxx::_Lock_policy)2> *)&local_68,__p);
  std::__shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(&local_58);
  operator_delete__(sampleBuf);
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(&local_40);
  std::
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_70);
  return &this->_M_ptr;
}

Assistant:

duckdb_fsst_encoder_t* duckdb_fsst_create(size_t n, size_t lenIn[], u8 *strIn[], int zeroTerminated) {
	u8* sampleBuf = new u8[FSST_SAMPLEMAXSZ];
	unique_ptr<vector<size_t>> sample_sizes;
	vector<u8*> sample = makeSample(sampleBuf, strIn, lenIn, n?n:1, sample_sizes); // careful handling of input to get a right-size and representative sample
	Encoder *encoder = new Encoder();
	size_t* sampleLen = sample_sizes ? sample_sizes->data() : &lenIn[0];
	encoder->symbolTable = shared_ptr<SymbolTable>(buildSymbolTable(encoder->counters, sample, sampleLen, zeroTerminated));
	delete[] sampleBuf;
	return (duckdb_fsst_encoder_t*) encoder;
}